

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestPackage.cpp
# Opt level: O3

void __thiscall vkt::TestCaseExecutor::deinit(TestCaseExecutor *this,TestCase *param_1)

{
  ostringstream *this_00;
  TestContext *this_01;
  TestCaseExecutor *pTVar1;
  uint uVar2;
  long *plVar3;
  size_type *psVar4;
  ulong uVar5;
  DebugReportRecorder *pDVar6;
  Block *pBVar7;
  int iVar8;
  ScopedLogSection section;
  string local_218;
  TestLog *local_1f8;
  ScopedLogSection local_1f0;
  TestCaseExecutor *local_1e8;
  DebugReportRecorder *local_1e0;
  ulong local_1d8;
  long *local_1d0 [2];
  long local_1c0 [2];
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  if (this->m_instance != (TestInstance *)0x0) {
    (*this->m_instance->_vptr_TestInstance[1])();
  }
  this->m_instance = (TestInstance *)0x0;
  pDVar6 = (this->m_debugReportRecorder).
           super_UniqueBase<vk::DebugReportRecorder,_de::DefaultDeleter<vk::DebugReportRecorder>_>.
           m_data.ptr;
  if (pDVar6 != (DebugReportRecorder *)0x0) {
    local_1f8 = ((this->m_context).m_testCtx)->m_log;
    if (((pDVar6->m_messages).m_first != (pDVar6->m_messages).m_last) ||
       ((pDVar6->m_messages).m_numElements % (pDVar6->m_messages).m_blockSize != 0)) {
      local_1b0._0_8_ = (TestLog *)(local_1b0 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"DebugMessages","");
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Debug Messages","");
      tcu::ScopedLogSection::ScopedLogSection(&local_1f0,local_1f8,(string *)local_1b0,&local_218);
      local_1e8 = this;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((TestLog *)local_1b0._0_8_ != (TestLog *)(local_1b0 + 0x10)) {
        operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
      }
      local_1d8 = (pDVar6->m_messages).m_blockSize;
      pBVar7 = (pDVar6->m_messages).m_first;
      iVar8 = 0;
      if ((pBVar7 != (pDVar6->m_messages).m_last) ||
         ((pDVar6->m_messages).m_numElements % local_1d8 != 0)) {
        this_00 = (ostringstream *)(local_1b0 + 8);
        iVar8 = 0;
        uVar5 = 0;
        local_1e0 = pDVar6;
        do {
          uVar2 = pBVar7->elements[uVar5].flags;
          if ((uVar2 & 0xe) != 0) {
            local_1b0._0_8_ = local_1f8;
            std::__cxx11::ostringstream::ostringstream(this_00);
            ::vk::operator<<((ostream *)this_00,pBVar7->elements + uVar5);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(this_00);
            std::ios_base::~ios_base(local_138);
            uVar2 = pBVar7->elements[uVar5].flags;
            pDVar6 = local_1e0;
          }
          iVar8 = iVar8 + (uint)((uVar2 >> 3 & 1) != 0);
          uVar5 = uVar5 + 1;
          if (uVar5 == local_1d8) {
            pBVar7 = pBVar7->next;
            uVar5 = 0;
          }
        } while ((pBVar7 != (pDVar6->m_messages).m_last) ||
                (uVar5 != (pDVar6->m_messages).m_numElements % (pDVar6->m_messages).m_blockSize));
      }
      pTVar1 = local_1e8;
      de::AppendList<vk::DebugReportMessage>::clear
                (&((local_1e8->m_debugReportRecorder).
                   super_UniqueBase<vk::DebugReportRecorder,_de::DefaultDeleter<vk::DebugReportRecorder>_>
                   .m_data.ptr)->m_messages);
      if (0 < iVar8) {
        this_01 = (pTVar1->m_context).m_testCtx;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::ostream::operator<<(local_1b0,iVar8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
        std::ios_base::~ios_base(local_140);
        plVar3 = (long *)std::__cxx11::string::append((char *)local_1d0);
        psVar4 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_218.field_2._M_allocated_capacity = *psVar4;
          local_218.field_2._8_8_ = plVar3[3];
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        }
        else {
          local_218.field_2._M_allocated_capacity = *psVar4;
          local_218._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_218._M_string_length = plVar3[1];
        *plVar3 = (long)psVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        tcu::TestContext::setTestResult
                  (this_01,QP_TEST_RESULT_INTERNAL_ERROR,local_218._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        if (local_1d0[0] != local_1c0) {
          operator_delete(local_1d0[0],local_1c0[0] + 1);
        }
      }
      tcu::TestLog::endSection(local_1f0.m_log);
    }
  }
  return;
}

Assistant:

void TestCaseExecutor::deinit (tcu::TestCase*)
{
	delete m_instance;
	m_instance = DE_NULL;

	// Collect and report any debug messages
	if (m_debugReportRecorder)
	{
		// \note We are not logging INFORMATION and DEBUG messages
		static const vk::VkDebugReportFlagsEXT			errorFlags		= vk::VK_DEBUG_REPORT_ERROR_BIT_EXT;
		static const vk::VkDebugReportFlagsEXT			logFlags		= errorFlags
																		| vk::VK_DEBUG_REPORT_WARNING_BIT_EXT
																		| vk::VK_DEBUG_REPORT_PERFORMANCE_WARNING_BIT_EXT;

		typedef vk::DebugReportRecorder::MessageList	DebugMessages;

		const DebugMessages&	messages	= m_debugReportRecorder->getMessages();
		tcu::TestLog&			log			= m_context.getTestContext().getLog();

		if (messages.begin() != messages.end())
		{
			const tcu::ScopedLogSection	section		(log, "DebugMessages", "Debug Messages");
			int							numErrors	= 0;

			for (DebugMessages::const_iterator curMsg = messages.begin(); curMsg != messages.end(); ++curMsg)
			{
				if ((curMsg->flags & logFlags) != 0)
					log << tcu::TestLog::Message << *curMsg << tcu::TestLog::EndMessage;

				if ((curMsg->flags & errorFlags) != 0)
					numErrors += 1;
			}

			m_debugReportRecorder->clearMessages();

			if (numErrors > 0)
				m_context.getTestContext().setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, (de::toString(numErrors) + " API usage errors found").c_str());
		}
	}
}